

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_getBoolOptionValues
                   (void *highs,char *option,HighsInt *current_value,HighsInt *default_value)

{
  HighsStatus HVar1;
  uint *in_RCX;
  uint *in_RDX;
  char *in_RSI;
  Highs *in_RDI;
  HighsInt retcode;
  bool default_v;
  bool current_v;
  bool *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  allocator local_49;
  string local_48 [38];
  byte local_22;
  byte local_21;
  uint *local_20;
  uint *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,in_RSI,&local_49);
  HVar1 = Highs::getBoolOptionValues
                    (in_RDI,(string *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78,(bool *)0x437cc3);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (local_18 != (uint *)0x0) {
    *local_18 = (uint)(local_21 & 1);
  }
  if (local_20 != (uint *)0x0) {
    *local_20 = (uint)(local_22 & 1);
  }
  return HVar1;
}

Assistant:

HighsInt Highs_getBoolOptionValues(const void* highs, const char* option,
                                   HighsInt* current_value,
                                   HighsInt* default_value) {
  bool current_v;
  bool default_v;
  HighsInt retcode =
      (HighsInt)((Highs*)highs)
          ->getBoolOptionValues(std::string(option), &current_v, &default_v);
  if (current_value) *current_value = current_v;
  if (default_value) *default_value = default_v;
  return retcode;
}